

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QDockAreaLayout *layout)

{
  undefined8 uVar1;
  QTextStream *pQVar2;
  long in_RDX;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  local_c8 = 0xaaaaaaaa;
  uStack_c4 = 0xaaaaaaaa;
  uStack_c0 = 0xaaaaaaaa;
  uStack_bc = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_c8,&local_b8,3);
  pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_c8,"QDockAreaLayout: ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,*(int *)(in_RDX + 0x10));
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,',');
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,*(int *)(in_RDX + 0x14));
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,' ');
  pQVar2 = (QTextStream *)
           QTextStream::operator<<(pQVar2,(*(int *)(in_RDX + 0x18) - *(int *)(in_RDX + 0x10)) + 1);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,'x');
  pQVar2 = (QTextStream *)
           QTextStream::operator<<(pQVar2,(*(int *)(in_RDX + 0x1c) - *(int *)(in_RDX + 0x14)) + 1);
  QTextStream::operator<<(pQVar2,'\n');
  QTextStream::operator<<((QTextStream *)&local_c8,"TopDockArea:\n");
  latin1.m_data = "  ";
  latin1.m_size = 2;
  QString::QString((QString *)&local_50,latin1);
  dumpLayout((QTextStream *)&local_c8,(QDockAreaLayoutInfo *)(in_RDX + 0x120),(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QTextStream::operator<<((QTextStream *)&local_c8,"LeftDockArea:\n");
  latin1_00.m_data = "  ";
  latin1_00.m_size = 2;
  QString::QString((QString *)&local_68,latin1_00);
  dumpLayout((QTextStream *)&local_c8,(QDockAreaLayoutInfo *)(in_RDX + 0x40),(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QTextStream::operator<<((QTextStream *)&local_c8,"RightDockArea:\n");
  latin1_01.m_data = "  ";
  latin1_01.m_size = 2;
  QString::QString((QString *)&local_80,latin1_01);
  dumpLayout((QTextStream *)&local_c8,(QDockAreaLayoutInfo *)(in_RDX + 0xb0),(QString *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QTextStream::operator<<((QTextStream *)&local_c8,"BottomDockArea:\n");
  latin1_02.m_data = "  ";
  latin1_02.m_size = 2;
  QString::QString((QString *)&local_98,latin1_02);
  dumpLayout((QTextStream *)&local_c8,(QDockAreaLayoutInfo *)(in_RDX + 400),(QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QDebug::operator<<((QDebug *)layout,(QString *)&local_b8);
  uVar1 = *(undefined8 *)layout->corners;
  layout->corners[0] = NoDockWidgetArea;
  layout->corners[1] = NoDockWidgetArea;
  *(undefined8 *)debug.stream = uVar1;
  QTextStream::~QTextStream((QTextStream *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDockAreaLayout &layout)
{
    QString s;
    QTextStream str(&s);
    dumpLayout(str, layout);
    debug << s;
    return debug;
}